

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsGenerators.cpp
# Opt level: O1

void __thiscall
chrono::utils::MixtureIngredient::setDistributionDensity
          (MixtureIngredient *this,double density_mean,double density_stddev,double density_min,
          double density_max)

{
  normal_distribution<double> *pnVar1;
  
  pnVar1 = (normal_distribution<double> *)::operator_new(0x20);
  (pnVar1->_M_param)._M_mean = density_mean;
  (pnVar1->_M_param)._M_stddev = density_stddev;
  pnVar1->_M_saved = 0.0;
  pnVar1->_M_saved_available = false;
  this->m_densityDist = pnVar1;
  this->m_minDensity = density_min;
  this->m_maxDensity = density_max;
  return;
}

Assistant:

void MixtureIngredient::setDistributionDensity(double density_mean,
                                               double density_stddev,
                                               double density_min,
                                               double density_max) {
    m_densityDist = new std::normal_distribution<double>(density_mean, density_stddev);
    m_minDensity = density_min;
    m_maxDensity = density_max;
}